

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpTestLog.c
# Opt level: O0

deBool qpTestLog_writeShader
                 (qpTestLog *log,qpShaderType type,char *source,deBool compileOk,char *infoLog)

{
  deBool dVar1;
  char *elementName;
  char *value;
  char *local_100;
  undefined1 local_f8 [16];
  char *local_e8;
  char *local_e0;
  undefined1 local_d8 [8];
  qpXmlAttribute shaderAttribs [4];
  int numShaderAttribs;
  char *sourceStr;
  char *tagName;
  char *infoLog_local;
  deBool compileOk_local;
  char *source_local;
  qpShaderType type_local;
  qpTestLog *log_local;
  
  elementName = qpLookupString(s_qpShaderTypeMap,7,type);
  local_100 = source;
  if (((log->flags & 2) != 0) && (compileOk != 0)) {
    local_100 = "";
  }
  deMutex_lock(log->lock);
  value = "Fail";
  if (compileOk != 0) {
    value = "OK";
  }
  qpSetStringAttrib((qpXmlAttribute *)local_f8,"CompileStatus",value);
  local_d8 = (undefined1  [8])local_f8._0_8_;
  shaderAttribs[0].name = (char *)local_f8._8_8_;
  shaderAttribs[0]._8_8_ = local_e8;
  shaderAttribs[0].stringValue = local_e0;
  dVar1 = qpXmlWriter_startElement(log->writer,elementName,1,(qpXmlAttribute *)local_d8);
  if ((((dVar1 == 0) ||
       (dVar1 = qpXmlWriter_writeStringElement(log->writer,"ShaderSource",local_100), dVar1 == 0))
      || (dVar1 = qpXmlWriter_writeStringElement(log->writer,"InfoLog",infoLog), dVar1 == 0)) ||
     (dVar1 = qpXmlWriter_endElement(log->writer,elementName), dVar1 == 0)) {
    qpPrintf("qpTestLog_writeShader(): Writing XML failed\n");
    deMutex_unlock(log->lock);
    log_local._4_4_ = 0;
  }
  else {
    deMutex_unlock(log->lock);
    log_local._4_4_ = 1;
  }
  return log_local._4_4_;
}

Assistant:

deBool qpTestLog_writeShader (qpTestLog* log, qpShaderType type, const char* source, deBool compileOk, const char* infoLog)
{
	const char*		tagName				= QP_LOOKUP_STRING(s_qpShaderTypeMap, type);
	const char*		sourceStr			= ((log->flags & QP_TEST_LOG_EXCLUDE_SHADER_SOURCES) == 0 || !compileOk) ? source : "";
	int				numShaderAttribs	= 0;
	qpXmlAttribute	shaderAttribs[4];

	deMutex_lock(log->lock);

	DE_ASSERT(source);
	DE_ASSERT(ContainerStack_getTop(&log->containerStack) == CONTAINERTYPE_SHADERPROGRAM);

	shaderAttribs[numShaderAttribs++]	= qpSetStringAttrib("CompileStatus", compileOk ? "OK" : "Fail");

	if (!qpXmlWriter_startElement(log->writer, tagName, numShaderAttribs, shaderAttribs) ||
		!qpXmlWriter_writeStringElement(log->writer, "ShaderSource", sourceStr) ||
		!qpXmlWriter_writeStringElement(log->writer, "InfoLog", infoLog) ||
		!qpXmlWriter_endElement(log->writer, tagName))
	{
		qpPrintf("qpTestLog_writeShader(): Writing XML failed\n");
		deMutex_unlock(log->lock);
		return DE_FALSE;
	}

	deMutex_unlock(log->lock);
	return DE_TRUE;
}